

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Chapters::Edition::ParseAtom
          (Edition *this,IMkvReader *pReader,longlong pos,longlong size)

{
  int iVar1;
  bool bVar2;
  long *in_RDI;
  longlong unaff_retaddr;
  Atom *a;
  Edition *in_stack_00000098;
  undefined8 local_8;
  
  bVar2 = ExpandAtomsArray(in_stack_00000098);
  if (bVar2) {
    iVar1 = *(int *)((long)in_RDI + 0xc);
    *(int *)((long)in_RDI + 0xc) = iVar1 + 1;
    Atom::Init((Atom *)(*in_RDI + (long)iVar1 * 0x30));
    local_8 = Atom::Parse((Atom *)pos,(IMkvReader *)size,(longlong)a,unaff_retaddr);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long Chapters::Edition::ParseAtom(IMkvReader* pReader, long long pos,
                                  long long size) {
  if (!ExpandAtomsArray())
    return -1;

  Atom& a = m_atoms[m_atoms_count++];
  a.Init();

  return a.Parse(pReader, pos, size);
}